

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsst.cpp
# Opt level: O2

void __thiscall
duckdb::FSSTAnalyzeState::FSSTAnalyzeState(FSSTAnalyzeState *this,CompressionInfo *info)

{
  Allocator *allocator;
  
  (this->super_AnalyzeState).info.block_manager = info->block_manager;
  (this->super_AnalyzeState)._vptr_AnalyzeState = (_func_int **)&PTR__FSSTAnalyzeState_0178a6a8;
  this->fsst_encoder = (duckdb_fsst_encoder_t *)0x0;
  this->count = 0;
  allocator = Allocator::DefaultAllocator();
  StringHeap::StringHeap(&this->fsst_string_heap,allocator);
  (this->fsst_strings).super_vector<duckdb::string_t,_std::allocator<duckdb::string_t>_>.
  super__Vector_base<duckdb::string_t,_std::allocator<duckdb::string_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->fsst_string_total_size = 0;
  (this->fsst_strings).super_vector<duckdb::string_t,_std::allocator<duckdb::string_t>_>.
  super__Vector_base<duckdb::string_t,_std::allocator<duckdb::string_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->fsst_strings).super_vector<duckdb::string_t,_std::allocator<duckdb::string_t>_>.
  super__Vector_base<duckdb::string_t,_std::allocator<duckdb::string_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  RandomEngine::RandomEngine(&this->random_engine,-1);
  this->have_valid_row = false;
  this->empty_strings = 0;
  return;
}

Assistant:

explicit FSSTAnalyzeState(const CompressionInfo &info)
	    : AnalyzeState(info), count(0), fsst_string_total_size(0), empty_strings(0) {
	}